

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTimer.h
# Opt level: O3

void __thiscall HTimer::report(HTimer *this,int itemCount,int *itemList)

{
  double dVar1;
  undefined8 uVar2;
  undefined1 auVar3 [12];
  undefined4 uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  
  uVar2 = rdtsc();
  uVar4 = (undefined4)((ulong)uVar2 >> 0x20);
  auVar3._4_4_ = uVar4;
  auVar3._0_4_ = uVar4;
  auVar3._8_4_ = 0;
  auVar6._0_12_ = auVar3 << 0x20;
  auVar6._12_4_ = 0x45300000;
  dVar1 = this->startTick;
  printf("profile-name ");
  if (itemCount < 1) {
    putchar(10);
    printf("profile-item ");
  }
  else {
    uVar5 = 0;
    do {
      printf(" %s",this->itemNames[itemList[uVar5]]._M_dataplus._M_p);
      uVar5 = uVar5 + 1;
    } while ((uint)itemCount != uVar5);
    putchar(10);
    printf("profile-item ");
    if (0 < itemCount) {
      uVar5 = 0;
      do {
        printf(" %3d",(ulong)(uint)(int)((this->itemTicks[itemList[uVar5]] * 1000.0) /
                                        (((auVar6._8_8_ - 1.9342813113834067e+25) +
                                         ((double)CONCAT44(0x43300000,(int)uVar2) -
                                         4503599627370496.0)) - dVar1)));
        uVar5 = uVar5 + 1;
      } while ((uint)itemCount != uVar5);
    }
  }
  putchar(10);
  return;
}

Assistant:

void report(int itemCount, int *itemList) {
        double totalTick = getTick();
        printf("profile-name ");
        for (int i = 0; i < itemCount; i++)
            printf(" %s", itemNames[itemList[i]].c_str());
        printf("\n");
        printf("profile-item ");
        for (int i = 0; i < itemCount; i++) {
            int percent = 1000.0 * itemTicks[itemList[i]] / totalTick;
            printf(" %3d", percent);
        }
        printf("\n");
    }